

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txout_txoutreference.cpp
# Opt level: O0

void __thiscall TxOutReference_Constractor_Test::TestBody(TxOutReference_Constractor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  Amount AVar3;
  AssertHelper local_230;
  Message local_228;
  string local_220;
  Script local_200;
  string local_1c8;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_2;
  Message local_190;
  bool local_181;
  Script local_180;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_1;
  Message local_128;
  int64_t local_120;
  undefined1 local_118;
  Amount local_110;
  int64_t local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar;
  undefined1 local_d8 [8];
  TxOutReference txout_ref;
  Amount local_78;
  undefined1 local_68 [8];
  TxOut txout;
  int64_t satoshi;
  TxOutReference_Constractor_Test *this_local;
  
  txout.super_AbstractTxOut.locking_script_.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0xf4240;
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(1000000);
  txout_ref.super_AbstractTxOutReference.locking_script_.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)AVar3.amount_;
  local_78.ignore_check_ = AVar3.ignore_check_;
  local_78.amount_ =
       (int64_t)txout_ref.super_AbstractTxOutReference.locking_script_.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  cfd::core::TxOut::TxOut((TxOut *)local_68,&local_78,&exp_script);
  cfd::core::TxOutReference::TxOutReference((TxOutReference *)local_d8,(TxOut *)local_68);
  AVar3 = cfd::core::AbstractTxOutReference::GetValue((AbstractTxOutReference *)local_d8);
  local_120 = AVar3.amount_;
  local_118 = AVar3.ignore_check_;
  local_110.amount_ = local_120;
  local_110.ignore_check_ = (bool)local_118;
  local_100 = cfd::core::Amount::GetSatoshiValue(&local_110);
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_f8,"txout_ref.GetValue().GetSatoshiValue()","satoshi",
             &local_100,
             (long *)((long)&txout.super_AbstractTxOut.locking_script_.script_stack_.
                             super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                             ._M_impl.super__Vector_impl_data + 0x10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txout_txoutreference.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  cfd::core::AbstractTxOutReference::GetLockingScript(&local_180,(AbstractTxOutReference *)local_d8)
  ;
  local_141 = cfd::core::Script::IsEmpty(&local_180);
  local_181 = false;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_140,"txout_ref.GetLockingScript().IsEmpty()","false",
             &local_141,&local_181);
  cfd::core::Script::~Script(&local_180);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txout_txoutreference.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  cfd::core::AbstractTxOutReference::GetLockingScript(&local_200,(AbstractTxOutReference *)local_d8)
  ;
  cfd::core::Script::GetHex_abi_cxx11_(&local_1c8,&local_200);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Script::GetHex_abi_cxx11_(&local_220,&exp_script);
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1a8,"txout_ref.GetLockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",pcVar2,rhs);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_1c8);
  cfd::core::Script::~Script(&local_200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txout_txoutreference.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  cfd::core::TxOutReference::~TxOutReference((TxOutReference *)local_d8);
  cfd::core::TxOut::~TxOut((TxOut *)local_68);
  return;
}

Assistant:

TEST(TxOutReference, Constractor) {
  {
    int64_t satoshi = 1000000;
    TxOut txout(Amount::CreateBySatoshiAmount(satoshi), exp_script);
    TxOutReference txout_ref(txout);

    EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(), satoshi);
    EXPECT_EQ(txout_ref.GetLockingScript().IsEmpty(), false);
    EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
                 exp_script.GetHex().c_str());
  }
}